

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_type_create_indexed_block_
               (MPIABI_Fint *count,MPIABI_Fint *blocklength,int *array_of_displacements,
               MPIABI_Fint *oldtype,MPIABI_Fint *newtype,MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *newtype_local;
  MPIABI_Fint *oldtype_local;
  int *array_of_displacements_local;
  MPIABI_Fint *blocklength_local;
  MPIABI_Fint *count_local;
  
  mpi_type_create_indexed_block_(count,blocklength,array_of_displacements,oldtype,newtype,ierror);
  return;
}

Assistant:

void mpiabi_type_create_indexed_block_(
  const MPIABI_Fint * count,
  const MPIABI_Fint * blocklength,
  const int * array_of_displacements,
  const MPIABI_Fint * oldtype,
  MPIABI_Fint * newtype,
  MPIABI_Fint * ierror
) {
  return mpi_type_create_indexed_block_(
    count,
    blocklength,
    array_of_displacements,
    oldtype,
    newtype,
    ierror
  );
}